

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5HashAddPoslistSize(Fts5Hash *pHash,Fts5HashEntry *p,Fts5HashEntry *p2)

{
  int iVar1;
  int iVar2;
  u32 iVal;
  int iVar3;
  Fts5HashEntry *local_48;
  int nByte;
  int nPos;
  int nSz;
  int nData;
  u8 *pPtr;
  int nRet;
  Fts5HashEntry *p2_local;
  Fts5HashEntry *p_local;
  Fts5Hash *pHash_local;
  
  pPtr._4_4_ = 0;
  if (p->iSzPoslist != 0) {
    local_48 = p;
    if (p2 != (Fts5HashEntry *)0x0) {
      local_48 = p2;
    }
    iVar1 = p->nData;
    nPos = iVar1;
    if (pHash->eDetail == 1) {
      if (p->bDel != '\0') {
        *(undefined1 *)((long)&local_48->pHashNext + (long)iVar1) = 0;
        nPos = iVar1 + 1;
        if (p->bContent != '\0') {
          nPos = iVar1 + 2;
          *(undefined1 *)((long)&local_48->pHashNext + (long)(iVar1 + 1)) = 0;
        }
      }
    }
    else {
      iVar2 = (iVar1 - p->iSzPoslist) + -1;
      iVal = iVar2 * 2 + (uint)p->bDel;
      if ((int)iVal < 0x80) {
        *(char *)((long)&local_48->pHashNext + (long)p->iSzPoslist) = (char)iVal;
      }
      else {
        iVar3 = sqlite3Fts5GetVarintLen(iVal);
        memmove((void *)((long)&local_48->pHashNext + (long)(p->iSzPoslist + iVar3)),
                (void *)((long)&local_48->pHashNext + (long)(p->iSzPoslist + 1)),(long)iVar2);
        sqlite3Fts5PutVarint
                  ((uchar *)((long)&local_48->pHashNext + (long)p->iSzPoslist),(long)(int)iVal);
        nPos = iVar3 + -1 + iVar1;
      }
    }
    pPtr._4_4_ = nPos - p->nData;
    if (p2 == (Fts5HashEntry *)0x0) {
      p->iSzPoslist = 0;
      p->bDel = '\0';
      p->bContent = '\0';
      p->nData = nPos;
    }
  }
  return pPtr._4_4_;
}

Assistant:

static int fts5HashAddPoslistSize(
  Fts5Hash *pHash, 
  Fts5HashEntry *p,
  Fts5HashEntry *p2
){
  int nRet = 0;
  if( p->iSzPoslist ){
    u8 *pPtr = p2 ? (u8*)p2 : (u8*)p;
    int nData = p->nData;
    if( pHash->eDetail==FTS5_DETAIL_NONE ){
      assert( nData==p->iSzPoslist );
      if( p->bDel ){
        pPtr[nData++] = 0x00;
        if( p->bContent ){
          pPtr[nData++] = 0x00;
        }
      }
    }else{
      int nSz = (nData - p->iSzPoslist - 1);       /* Size in bytes */
      int nPos = nSz*2 + p->bDel;                     /* Value of nPos field */

      assert( p->bDel==0 || p->bDel==1 );
      if( nPos<=127 ){
        pPtr[p->iSzPoslist] = (u8)nPos;
      }else{
        int nByte = sqlite3Fts5GetVarintLen((u32)nPos);
        memmove(&pPtr[p->iSzPoslist + nByte], &pPtr[p->iSzPoslist + 1], nSz);
        sqlite3Fts5PutVarint(&pPtr[p->iSzPoslist], nPos);
        nData += (nByte-1);
      }
    }

    nRet = nData - p->nData;
    if( p2==0 ){
      p->iSzPoslist = 0;
      p->bDel = 0;
      p->bContent = 0;
      p->nData = nData;
    }
  }
  return nRet;
}